

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

void wasm::TypeUpdating::handleNonDefaultableLocals(Function *func,Module *wasm)

{
  size_t *this;
  uint index_00;
  pointer pTVar1;
  Expression **ppEVar2;
  LocalGet *get;
  LocalSet *this_00;
  pointer pppEVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  Expression *pEVar7;
  HeapType heapType;
  RefAs *this_01;
  Type TVar8;
  size_t sVar9;
  char *__function;
  pointer pTVar10;
  undefined8 *puVar11;
  pointer pppEVar12;
  undefined1 local_d8 [8];
  LocalStructuralDominance info;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  badIndexes;
  FindAllPointers<wasm::LocalGet> local_50;
  Type local_38;
  uint index;
  
  if (((wasm->features).features & 0x1100) == 0x100) {
    pTVar10 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start;
    pTVar1 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar10 != pTVar1) {
      this = &info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count;
      do {
        info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = pTVar10->id;
        bVar4 = wasm::Type::isNonNullable((Type *)this);
        if (bVar4) {
          LocalStructuralDominance::LocalStructuralDominance
                    ((LocalStructuralDominance *)local_d8,func,wasm,NonNullableOnly);
          info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)&badIndexes._M_h._M_rehash_policy._M_next_resize;
          badIndexes._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
          badIndexes._M_h._M_bucket_count = 0;
          badIndexes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          badIndexes._M_h._M_element_count._0_4_ = 0x3f800000;
          badIndexes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          badIndexes._M_h._M_rehash_policy._4_4_ = 0;
          badIndexes._M_h._M_rehash_policy._M_next_resize = 0;
          if (info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Rb_tree_node_base *)&info) {
            p_Var5 = info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            do {
              local_38.id._0_4_ = p_Var5[1]._M_color;
              local_50.list.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)this;
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)this,&local_38,&local_50);
              local_50.list.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)Function::getLocalType(func,(_Rb_tree_color)local_38.id);
              bVar4 = wasm::Type::isNonNullable((Type *)&local_50);
              if (!bVar4) {
                __assert_fail("func->getLocalType(index).isNonNullable()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                              ,0x154,
                              "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                             );
              }
              bVar4 = Function::isParam(func,(_Rb_tree_color)local_38.id);
              if (bVar4) {
                __assert_fail("!func->isParam(index)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                              ,0x155,
                              "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                             );
              }
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
            } while (p_Var5 != (_Rb_tree_node_base *)&info);
            if (badIndexes._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              FindAllPointers<wasm::LocalGet>::FindAllPointers(&local_50,&func->body);
              pppEVar3 = local_50.list.
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (pppEVar12 = local_50.list.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start; pppEVar12 != pppEVar3;
                  pppEVar12 = pppEVar12 + 1) {
                ppEVar2 = *pppEVar12;
                get = (LocalGet *)*ppEVar2;
                if ((get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id !=
                    LocalGetId) {
                  __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
LAB_00aa31dc:
                  __assert_fail("int(_id) == int(T::SpecificId)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                                ,0x314,__function);
                }
                cVar6 = std::
                        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,&get->index);
                if (cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  pEVar7 = fixLocalGet(get,wasm);
                  *ppEVar2 = pEVar7;
                }
              }
              if (local_50.list.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_50.list.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_50.list.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_50.list.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              FindAllPointers<wasm::LocalSet>::FindAllPointers
                        ((FindAllPointers<wasm::LocalSet> *)&local_50,&func->body);
              if (local_50.list.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_50.list.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pppEVar12 = local_50.list.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                do {
                  ppEVar2 = *pppEVar12;
                  this_00 = (LocalSet *)*ppEVar2;
                  if ((this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                      _id != LocalSetId) {
                    __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
                    goto LAB_00aa31dc;
                  }
                  bVar4 = Function::isVar(func,this_00->index);
                  if (((bVar4) && (bVar4 = LocalSet::isTee(this_00), bVar4)) &&
                     ((this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                      type.id != 1)) {
                    cVar6 = std::
                            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count,&this_00->index);
                    if (cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                        (__node_type *)0x0) {
                      local_38 = Function::getLocalType(func,this_00->index);
                      heapType = wasm::Type::getHeapType(&local_38);
                      wasm::Type::Type((Type *)&badIndexes._M_h._M_single_bucket,heapType,Nullable);
                      (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                      type.id = (uintptr_t)badIndexes._M_h._M_single_bucket;
                      this_01 = (RefAs *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
                      (this_01->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression
                      ._id = RefAsId;
                      (this_01->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression
                      .type.id = 0;
                      this_01->op = RefAsNonNull;
                      this_01->value = (Expression *)this_00;
                      RefAs::finalize(this_01);
                      *ppEVar2 = (Expression *)this_01;
                    }
                  }
                  pppEVar12 = pppEVar12 + 1;
                } while (pppEVar12 !=
                         local_50.list.
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              puVar11 = (undefined8 *)badIndexes._M_h._M_bucket_count;
              if (local_50.list.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_50.list.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_50.list.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_50.list.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                puVar11 = (undefined8 *)badIndexes._M_h._M_bucket_count;
              }
              for (; puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
                index_00 = *(uint *)(puVar11 + 1);
                TVar8 = Function::getLocalType(func,index_00);
                TVar8 = getValidLocalType(TVar8,(FeatureSet)(wasm->features).features);
                sVar9 = Function::getNumParams(func);
                (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start[index_00 - sVar9].id = TVar8.id;
              }
            }
          }
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)local_d8);
          return;
        }
        pTVar10 = pTVar10 + 1;
      } while (pTVar10 != pTVar1);
    }
  }
  return;
}

Assistant:

void handleNonDefaultableLocals(Function* func, Module& wasm) {
  if (wasm.features.hasGCNNLocals()) {
    // We have nothing to fix up: all locals are allowed.
    return;
  }
  if (!wasm.features.hasReferenceTypes()) {
    // No references, so no non-nullable ones at all.
    return;
  }
  bool hasNonNullable = false;
  for (auto type : func->vars) {
    if (type.isNonNullable()) {
      hasNonNullable = true;
      break;
    }
  }
  if (!hasNonNullable) {
    // No non-nullable types exist in practice.
    return;
  }

  // Non-nullable locals exist, which we may need to fix up. See if they
  // validate as they are, that is, if they fall within the validation rules of
  // the wasm spec. We do not need to modify such locals.
  LocalStructuralDominance info(
    func, wasm, LocalStructuralDominance::NonNullableOnly);
  std::unordered_set<Index> badIndexes;
  for (auto index : info.nonDominatingIndices) {
    badIndexes.insert(index);

    // LocalStructuralDominance should have only looked at non-nullable indexes
    // since we told it to ignore nullable ones. Also, params always dominate
    // and should not appear here.
    assert(func->getLocalType(index).isNonNullable());
    assert(!func->isParam(index));
  }
  if (badIndexes.empty()) {
    return;
  }

  // Rewrite the local.gets.
  Builder builder(wasm);
  for (auto** getp : FindAllPointers<LocalGet>(func->body).list) {
    auto* get = (*getp)->cast<LocalGet>();
    if (badIndexes.count(get->index)) {
      *getp = fixLocalGet(get, wasm);
    }
  }

  // Update tees, whose type must match the local (if the wasm spec changes for
  // the type to be that of the value, then this can be removed).
  for (auto** setp : FindAllPointers<LocalSet>(func->body).list) {
    auto* set = (*setp)->cast<LocalSet>();
    if (!func->isVar(set->index)) {
      // We do not need to process params, which can legally be non-nullable.
      continue;
    }
    // Non-tees do not change, and unreachable tees can be ignored here as their
    // type is unreachable anyhow.
    if (!set->isTee() || set->type == Type::unreachable) {
      continue;
    }
    if (badIndexes.count(set->index)) {
      auto type = func->getLocalType(set->index);
      set->type = Type(type.getHeapType(), Nullable);
      *setp = builder.makeRefAs(RefAsNonNull, set);
    }
  }

  // Rewrite the types of the function's vars (which we can do now, after we
  // are done using them to know which local.gets etc to fix).
  for (auto index : badIndexes) {
    func->vars[index - func->getNumParams()] =
      getValidLocalType(func->getLocalType(index), wasm.features);
  }
}